

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall
Uniforms::set(Uniforms *this,string *_name,vector<float,_std::allocator<float>_> *_data,bool _queue)

{
  pointer pfVar1;
  mapped_type *this_00;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t _size;
  UniformValue value;
  UniformValue local_28;
  
  pfVar1 = (_data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (int)((ulong)((long)(_data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)pfVar1) >> 2);
  iVar3 = 4;
  if (iVar2 < 4) {
    iVar3 = iVar2;
  }
  _size = (size_t)iVar3;
  if (iVar2 != 0) {
    lVar4 = 0;
    do {
      local_28._M_elems[lVar4] = pfVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (_size + (_size == 0) != lVar4);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,&local_28,_size,false,_queue);
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set( const std::string& _name, const std::vector<float>& _data, bool _queue) {
    UniformValue value;
    int N = std::min((int)_data.size(), 4);
    // memcpy(&value, _data.data(), N * sizeof(float) );
    for (size_t i = 0; i < N; i++)
        value[i] = _data[i];
    data[_name].set(value, N, false, _queue);
    m_change = true;
}